

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O0

void SRCTools::SincResampler::Utils::computeResampleFactors
               (uint *upsampleFactor,double *downsampleFactor,double inputFrequency,
               double outputFrequency,uint maxUpsampleFactor)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double testFactor;
  uint i;
  double inputToOutputRatio;
  uint gcd;
  uint downsampleFactorInt;
  uint maxUpsampleFactor_local;
  double outputFrequency_local;
  double inputFrequency_local;
  double *downsampleFactor_local;
  uint *upsampleFactor_local;
  
  *upsampleFactor = (uint)(long)outputFrequency;
  uVar2 = (ulong)inputFrequency;
  if (((((double)*upsampleFactor != outputFrequency) ||
       (NAN((double)*upsampleFactor) || NAN(outputFrequency))) ||
      ((double)(uVar2 & 0xffffffff) != inputFrequency)) ||
     (NAN((double)(uVar2 & 0xffffffff)) || NAN(inputFrequency))) {
    for (testFactor._4_4_ = 1; testFactor._4_4_ <= maxUpsampleFactor;
        testFactor._4_4_ = testFactor._4_4_ + 1) {
      dVar3 = (inputFrequency / outputFrequency) * (double)testFactor._4_4_;
      dVar4 = floor(dVar3 * 1e+15 + 0.5);
      dVar5 = floor(dVar3 + 0.5);
      if ((dVar4 == dVar5 * 1e+15) && (!NAN(dVar4) && !NAN(dVar5 * 1e+15))) {
        *upsampleFactor = testFactor._4_4_;
        dVar3 = floor(dVar3 + 0.5);
        *downsampleFactor = dVar3;
        return;
      }
    }
  }
  else {
    uVar1 = greatestCommonDivisor(*upsampleFactor,(uint)uVar2);
    if (uVar1 < 2) {
      *downsampleFactor = (double)(uVar2 & 0xffffffff);
    }
    else {
      *upsampleFactor = *upsampleFactor / uVar1;
      *downsampleFactor = (double)((uVar2 & 0xffffffff) / (ulong)uVar1);
    }
    if (*upsampleFactor <= maxUpsampleFactor) {
      return;
    }
  }
  *upsampleFactor = maxUpsampleFactor;
  *downsampleFactor = ((double)maxUpsampleFactor * inputFrequency) / outputFrequency;
  return;
}

Assistant:

void Utils::computeResampleFactors(unsigned int &upsampleFactor, double &downsampleFactor, const double inputFrequency, const double outputFrequency, const unsigned int maxUpsampleFactor) {
	static const double RATIONAL_RATIO_ACCURACY_FACTOR = 1E15;

	upsampleFactor = static_cast<unsigned int>(outputFrequency);
	unsigned int downsampleFactorInt = static_cast<unsigned int>(inputFrequency);
	if ((upsampleFactor == outputFrequency) && (downsampleFactorInt == inputFrequency)) {
		// Input and output frequencies are integers, try to reduce them
		const unsigned int gcd = greatestCommonDivisor(upsampleFactor, downsampleFactorInt);
		if (gcd > 1) {
			upsampleFactor /= gcd;
			downsampleFactor = downsampleFactorInt / gcd;
		} else {
			downsampleFactor = downsampleFactorInt;
		}
		if (upsampleFactor <= maxUpsampleFactor) return;
	} else {
		// Try to recover rational resample ratio by brute force
		double inputToOutputRatio = inputFrequency / outputFrequency;
		for (unsigned int i = 1; i <= maxUpsampleFactor; ++i) {
			double testFactor = inputToOutputRatio * i;
			if (floor(RATIONAL_RATIO_ACCURACY_FACTOR * testFactor + 0.5) == RATIONAL_RATIO_ACCURACY_FACTOR * floor(testFactor + 0.5)) {
				// inputToOutputRatio found to be rational within the accuracy
				upsampleFactor = i;
				downsampleFactor = floor(testFactor + 0.5);
				return;
			}
		}
	}
	// Use interpolation of FIR taps as the last resort
	upsampleFactor = maxUpsampleFactor;
	downsampleFactor = maxUpsampleFactor * inputFrequency / outputFrequency;
}